

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall Diffusion::checkBeta(Diffusion *this,MultiFab **beta,int *allthere)

{
  int d;
  long lVar1;
  uint uVar2;
  
  *allthere = (uint)(beta != (MultiFab **)0x0);
  if (beta != (MultiFab **)0x0) {
    uVar2 = 1;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)(beta[lVar1] != (MultiFab *)0x0);
      }
    }
    *allthere = uVar2;
    if (uVar2 != 0) {
      return;
    }
  }
  amrex::Abort_host("Diffusion::checkBeta(): beta must be all non-0");
  return;
}

Assistant:

void
Diffusion::checkBeta (const MultiFab* const* beta,
                      int&                   allthere) const
{
    allthere = beta != 0;

    if (allthere)
    {
        for (int d = 0; d < AMREX_SPACEDIM; d++)
            allthere = allthere && beta[d] != 0;
    }

    if (!allthere)
        amrex::Abort("Diffusion::checkBeta(): beta must be all non-0");
}